

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_collective.cpp
# Opt level: O3

void __thiscall MxxColl_All2allOne_Test::~MxxColl_All2allOne_Test(MxxColl_All2allOne_Test *this)

{
  testing::Test::~Test(&this->super_Test);
  operator_delete(this);
  return;
}

Assistant:

TEST(MxxColl, All2allOne) {
    mxx::comm c;
    srand(0); // make test reproducable

    // create single message for each processor
    std::vector<std::pair<int, int> > msgs(c.size());
    for (int i = 0; i < c.size(); ++i) {
        msgs[i].first = c.rank() * i;
        msgs[i].second = rand();
    }

    // first all2all
    std::vector<std::pair<int, int> > result(c.size());
    mxx::all2all(&msgs[0], 1, &result[0], c);
    for (int i = 0; i < c.size(); ++i) {
        ASSERT_EQ(i*c.rank(), result[i].first);
        // change the random number
        result[i].second /= 13;
    }

    // send back
    std::vector<std::pair<int, int> > result2 = mxx::all2all(result, c);
    ASSERT_EQ(c.size(), (int)result2.size());
    // check the result
    for (int i = 0; i < c.size(); ++i) {
        ASSERT_EQ(i*c.rank(), result2[i].first);
        ASSERT_EQ(msgs[i].second / 13, result2[i].second);
    }

    // test the last convenience function
    std::vector<std::pair<int, int> > result3 = mxx::all2all(&result2[0], 1);
    // check result
    ASSERT_EQ(c.size(), (int)result3.size());
    for (int i = 0; i < c.size(); ++i) {
        ASSERT_EQ(result[i].first, result3[i].first);
        ASSERT_EQ(result[i].second, result3[i].second);
    }
}